

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identityTable.cpp
# Opt level: O2

bool __thiscall identityTable::contains(identityTable *this,string *name)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  string name1;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  for (sVar3 = 0; local_40._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar1 = tolower((int)local_40._M_dataplus._M_p[sVar3]);
    local_40._M_dataplus._M_p[sVar3] = (char)iVar1;
  }
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Identifier,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Identifier>_>_>
          ::count(&this->tokens,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return sVar2 != 0;
}

Assistant:

bool identityTable::contains(const string &name) {
    string name1 = name;
    transform(name1.begin(), name1.end(), name1.begin(), ::tolower);
    if (tokens.count(name1) == 0)
        return false;
    else
        return true;
}